

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

CNetMessage * __thiscall
V1Transport::GetReceivedMessage
          (CNetMessage *__return_storage_ptr__,V1Transport *this,microseconds time,
          bool *reject_message)

{
  CMessageHeader *this_00;
  uint32_t uVar1;
  long lVar2;
  bool bVar3;
  uint256 *puVar4;
  string *this_01;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  string_view str;
  string_view str_00;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock38;
  string local_b8;
  string local_98;
  string local_78;
  uint256 hash;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *reject_message = false;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock38,&this->m_recv_mutex,"m_recv_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0x30c,false);
  CNetMessage::CNetMessage(__return_storage_ptr__,&this->vRecv);
  this_00 = &this->hdr;
  CMessageHeader::GetCommand_abi_cxx11_((string *)&hash,this_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&__return_storage_ptr__->m_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hash);
  std::__cxx11::string::~string((string *)&hash);
  (__return_storage_ptr__->m_time).__r = time.__r;
  uVar1 = (this->hdr).nMessageSize;
  __return_storage_ptr__->m_message_size = uVar1;
  __return_storage_ptr__->m_raw_message_size = uVar1 + 0x18;
  puVar4 = GetMessageHash(this);
  hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
  hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
  hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
  hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
  RandAddEvent(hash.super_base_blob<256U>.m_data._M_elems._0_4_);
  if (hash.super_base_blob<256U>.m_data._M_elems._0_4_ == *(int *)(this->hdr).pchChecksum) {
    bVar3 = CMessageHeader::IsCommandValid(this_00);
    if (bVar3) goto LAB_00177db7;
    bVar3 = ::LogAcceptCategory(NET,Debug);
    if (bVar3) {
      CMessageHeader::GetCommand_abi_cxx11_(&local_98,this_00);
      str._M_str = local_98._M_dataplus._M_p;
      str._M_len = local_98._M_string_length;
      SanitizeString_abi_cxx11_(&local_78,str,0);
      logging_function._M_str = "GetReceivedMessage";
      logging_function._M_len = 0x12;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file._M_len = 0x57;
      LogPrintFormatInternal<std::__cxx11::string,unsigned_int,long>
                (logging_function,source_file,0x324,NET,Debug,(ConstevalFormatString<3U>)0x687206,
                 &local_78,&__return_storage_ptr__->m_message_size,&this->m_node_id);
      std::__cxx11::string::~string((string *)&local_78);
      this_01 = &local_98;
      goto LAB_00177dae;
    }
  }
  else {
    bVar3 = ::LogAcceptCategory(NET,Debug);
    if (bVar3) {
      str_00._M_str = (__return_storage_ptr__->m_type)._M_dataplus._M_p;
      str_00._M_len = (__return_storage_ptr__->m_type)._M_string_length;
      SanitizeString_abi_cxx11_(&local_78,str_00,0);
      s.m_size = 4;
      s.m_data = (uchar *)&hash;
      HexStr_abi_cxx11_(&local_98,s);
      s_00.m_size = 4;
      s_00.m_data = (this->hdr).pchChecksum;
      HexStr_abi_cxx11_(&local_b8,s_00);
      logging_function_00._M_str = "GetReceivedMessage";
      logging_function_00._M_len = 0x12;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
      ;
      source_file_00._M_len = 0x57;
      LogPrintFormatInternal<std::__cxx11::string,unsigned_int,std::__cxx11::string,std::__cxx11::string,long>
                (logging_function_00,source_file_00,800,NET,Debug,
                 (ConstevalFormatString<5U>)0x6871bc,&local_78,
                 &__return_storage_ptr__->m_message_size,&local_98,&local_b8,&this->m_node_id);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_98);
      this_01 = &local_78;
LAB_00177dae:
      std::__cxx11::string::~string((string *)this_01);
    }
  }
  *reject_message = true;
LAB_00177db7:
  Reset(this);
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock38.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CNetMessage V1Transport::GetReceivedMessage(const std::chrono::microseconds time, bool& reject_message)
{
    AssertLockNotHeld(m_recv_mutex);
    // Initialize out parameter
    reject_message = false;
    // decompose a single CNetMessage from the TransportDeserializer
    LOCK(m_recv_mutex);
    CNetMessage msg(std::move(vRecv));

    // store message type string, time, and sizes
    msg.m_type = hdr.GetCommand();
    msg.m_time = time;
    msg.m_message_size = hdr.nMessageSize;
    msg.m_raw_message_size = hdr.nMessageSize + CMessageHeader::HEADER_SIZE;

    uint256 hash = GetMessageHash();

    // We just received a message off the wire, harvest entropy from the time (and the message checksum)
    RandAddEvent(ReadLE32(hash.begin()));

    // Check checksum and header message type string
    if (memcmp(hash.begin(), hdr.pchChecksum, CMessageHeader::CHECKSUM_SIZE) != 0) {
        LogDebug(BCLog::NET, "Header error: Wrong checksum (%s, %u bytes), expected %s was %s, peer=%d\n",
                 SanitizeString(msg.m_type), msg.m_message_size,
                 HexStr(Span{hash}.first(CMessageHeader::CHECKSUM_SIZE)),
                 HexStr(hdr.pchChecksum),
                 m_node_id);
        reject_message = true;
    } else if (!hdr.IsCommandValid()) {
        LogDebug(BCLog::NET, "Header error: Invalid message type (%s, %u bytes), peer=%d\n",
                 SanitizeString(hdr.GetCommand()), msg.m_message_size, m_node_id);
        reject_message = true;
    }

    // Always reset the network deserializer (prepare for the next message)
    Reset();
    return msg;
}